

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::ArrayMapMethod::checkArguments
          (ArrayMapMethod *this,ASTContext *context,Args *args,SourceRange range,
          Expression *iterExpr)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange callRange;
  bool bVar1;
  LanguageVersion LVar2;
  Compilation *this_00;
  Type *pTVar3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RDX;
  undefined8 in_RDI;
  long in_R9;
  QueueType *qt;
  AssociativeArrayType *aat;
  FixedSizeUnpackedArrayType *fsuat;
  Type *elemType;
  Type *arrayType;
  LanguageVersion languageVersion;
  Compilation *comp;
  string *arg;
  Diagnostic *this_01;
  ASTContext *in_stack_fffffffffffffef8;
  SourceLocation in_stack_ffffffffffffff00;
  SourceLocation in_stack_ffffffffffffff08;
  DiagCode code;
  Diagnostic *in_stack_ffffffffffffff20;
  string_view in_stack_ffffffffffffff28;
  Args *in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff4f;
  ASTContext *in_stack_ffffffffffffff50;
  SystemSubroutine *in_stack_ffffffffffffff58;
  SourceLocation in_stack_ffffffffffffff60;
  SourceLocation in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  Type *local_8;
  
  code = SUB84((ulong)in_RDI >> 0x20,0);
  this_00 = ASTContext::getCompilation((ASTContext *)0x131a6c1);
  arg = (string *)0x0;
  this_01 = (Diagnostic *)0x0;
  callRange.endLoc = in_stack_ffffffffffffff68;
  callRange.startLoc = in_stack_ffffffffffffff60;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                     (bool)in_stack_ffffffffffffff4f,in_stack_ffffffffffffff40,callRange,
                     in_stack_ffffffffffffff80,in_stack_ffffffffffffff88);
  if (bVar1) {
    if (in_R9 != 0) {
      LVar2 = Compilation::languageVersion((Compilation *)0x131a7dd);
      if ((int)LVar2 < 1) {
        sourceRange_00.endLoc = in_stack_ffffffffffffff08;
        sourceRange_00.startLoc = in_stack_ffffffffffffff00;
        ASTContext::addDiag(in_stack_fffffffffffffef8,code,sourceRange_00);
        slang::toString(Default);
        Diagnostic::operator<<(in_stack_ffffffffffffff20,in_stack_ffffffffffffff28);
      }
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0);
      not_null<const_slang::ast::Type_*>::operator->
                ((not_null<const_slang::ast::Type_*> *)0x131a89b);
      pTVar3 = Type::getCanonicalType((Type *)this_01);
      not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x131a8bc)
      ;
      pTVar3 = (Type *)(*(code *)(&DAT_015f3730 +
                                 *(int *)(&DAT_015f3730 +
                                         (ulong)((pTVar3->super_Symbol).kind -
                                                FixedSizeUnpackedArrayType) * 4)))();
      return pTVar3;
    }
    sourceRange.endLoc = in_stack_ffffffffffffff08;
    sourceRange.startLoc = in_stack_ffffffffffffff00;
    ASTContext::addDiag(in_stack_fffffffffffffef8,code,sourceRange);
    Diagnostic::operator<<(this_01,arg);
    local_8 = Compilation::getErrorType(this_00);
  }
  else {
    local_8 = Compilation::getErrorType(this_00);
  }
  return local_8;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression* iterExpr) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, true, args, range, 0, 0))
            return comp.getErrorType();

        if (!iterExpr) {
            context.addDiag(diag::ArrayLocatorWithClause, range) << name;
            return comp.getErrorType();
        }

        auto languageVersion = comp.languageVersion();
        if (languageVersion < LanguageVersion::v1800_2023)
            context.addDiag(diag::WrongLanguageVersion, range) << toString(languageVersion);

        auto& arrayType = args[0]->type->getCanonicalType();
        auto& elemType = *iterExpr->type;
        switch (arrayType.kind) {
            case SymbolKind::FixedSizeUnpackedArrayType: {
                auto& fsuat = arrayType.as<FixedSizeUnpackedArrayType>();
                return FixedSizeUnpackedArrayType::fromDim(*context.scope, elemType, fsuat.range,
                                                           iterExpr->sourceRange);
            }
            case SymbolKind::DynamicArrayType:
                return *comp.emplace<DynamicArrayType>(elemType);
            case SymbolKind::AssociativeArrayType: {
                auto& aat = arrayType.as<AssociativeArrayType>();
                return *comp.emplace<AssociativeArrayType>(elemType, aat.indexType);
            }
            case SymbolKind::QueueType: {
                auto& qt = arrayType.as<QueueType>();
                return *comp.emplace<QueueType>(elemType, qt.maxBound);
            }
            default:
                SLANG_UNREACHABLE;
        }
    }